

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O0

void __thiscall
DatabaseSnapshot::find_all_indexed_files
          (DatabaseSnapshot *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *existing_files)

{
  bool bVar1;
  long in_RDI;
  OnDiskDataset **ds;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range1;
  OnDiskDataset *in_stack_ffffffffffffff88;
  OnDiskDataset *in_stack_ffffffffffffff90;
  anon_class_8_1_38182101 *in_stack_ffffffffffffff98;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffffa0;
  undefined1 local_50 [40];
  OnDiskDataset **local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_20 [2];
  
  local_20[0]._8_8_ = in_RDI + 0xc0;
  local_20[0]._0_8_ =
       std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
                 ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                  in_stack_ffffffffffffff88);
  local_28 = (OnDiskDataset **)
             std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::end
                       ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                        in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    local_50._32_8_ =
         __gnu_cxx::
         __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
         ::operator*((__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                      *)&local_20[0]._M_allocated_capacity);
    in_stack_ffffffffffffff88 = *(OnDiskDataset **)local_50._32_8_;
    in_stack_ffffffffffffff90 = (OnDiskDataset *)local_50;
    std::function<void(std::__cxx11::string_const&)>::
    function<DatabaseSnapshot::find_all_indexed_files(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>*)const::__0,void>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    OnDiskDataset::for_each_filename
              (in_stack_ffffffffffffff90,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)in_stack_ffffffffffffff88);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)0x1891b4);
    __gnu_cxx::
    __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
    ::operator++((__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                  *)&local_20[0]._M_allocated_capacity);
  }
  return;
}

Assistant:

void DatabaseSnapshot::find_all_indexed_files(
    std::set<std::string> *existing_files) const {
    for (const auto &ds : datasets) {
        ds->for_each_filename([&existing_files](const std::string &fname) {
            existing_files->insert(fname);
        });
    }
}